

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendSpecs.hpp
# Opt level: O1

void __thiscall sciplot::LegendSpecs::LegendSpecs(LegendSpecs *this)

{
  string local_50;
  
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       &PTR__Specs_001a8b98;
  TextSpecsOf<sciplot::LegendSpecs>::TextSpecsOf
            (&this->super_TextSpecsOf<sciplot::LegendSpecs>,&PTR_PTR_001a6320);
  *(undefined8 *)&this->super_ShowSpecsOf<sciplot::LegendSpecs> = 0x1a6488;
  *(undefined8 *)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       0x1a64c0;
  (this->super_ShowSpecsOf<sciplot::LegendSpecs>).m_show = true;
  TitleSpecsOf<sciplot::LegendSpecs>::TitleSpecsOf
            (&this->super_TitleSpecsOf<sciplot::LegendSpecs>,&PTR_construction_vtable_40__001a6350);
  FrameSpecsOf<sciplot::LegendSpecs>::FrameSpecsOf
            (&this->super_FrameSpecsOf<sciplot::LegendSpecs>,&PTR_construction_vtable_40__001a6360);
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       &PTR__LegendSpecs_001a6240;
  *(undefined ***)&this->super_ShowSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001a6280;
  *(undefined ***)&this->super_TitleSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001a62c0;
  *(undefined ***)&this->super_FrameSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001a6300;
  (this->m_placement)._M_dataplus._M_p = (pointer)&(this->m_placement).field_2;
  (this->m_placement)._M_string_length = 0;
  (this->m_placement).field_2._M_local_buf[0] = '\0';
  (this->m_opaque)._M_dataplus._M_p = (pointer)&(this->m_opaque).field_2;
  (this->m_opaque)._M_string_length = 0;
  (this->m_opaque).field_2._M_local_buf[0] = '\0';
  (this->m_alignment)._M_dataplus._M_p = (pointer)&(this->m_alignment).field_2;
  (this->m_alignment)._M_string_length = 0;
  (this->m_alignment).field_2._M_local_buf[0] = '\0';
  (this->m_reverse)._M_dataplus._M_p = (pointer)&(this->m_reverse).field_2;
  (this->m_reverse)._M_string_length = 0;
  (this->m_reverse).field_2._M_local_buf[0] = '\0';
  (this->m_invert)._M_dataplus._M_p = (pointer)&(this->m_invert).field_2;
  (this->m_invert)._M_string_length = 0;
  (this->m_invert).field_2._M_local_buf[0] = '\0';
  (this->m_justification)._M_dataplus._M_p = (pointer)&(this->m_justification).field_2;
  (this->m_justification)._M_string_length = 0;
  (this->m_justification).field_2._M_local_buf[0] = '\0';
  (this->m_title_loc)._M_dataplus._M_p = (pointer)&(this->m_title_loc).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_title_loc,"left","");
  (this->m_maxrows)._M_dataplus._M_p = (pointer)&(this->m_maxrows).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_maxrows,"auto","");
  (this->m_maxcols)._M_dataplus._M_p = (pointer)&(this->m_maxcols).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_maxcols,"auto","");
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_placement,0,(char *)(this->m_placement)._M_string_length,0x18e570);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  TitleSpecsOf<sciplot::LegendSpecs>::title
            (&this->super_TitleSpecsOf<sciplot::LegendSpecs>,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->m_width_increment = 0;
  this->m_height_increment = 1;
  this->m_samplen = 4;
  this->m_spacing = 1;
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_alignment,0,(char *)(this->m_alignment)._M_string_length,0x18e581);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_reverse,0,(char *)(this->m_reverse)._M_string_length,0x18e58a);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_justification,0,(char *)(this->m_justification)._M_string_length,
             0x18e592);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_invert,0,(char *)(this->m_invert)._M_string_length,0x18e597);
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_opaque,0,(char *)(this->m_opaque)._M_string_length,0x18e5a0);
  return;
}

Assistant:

inline LegendSpecs::LegendSpecs()
{
    atTopRight();
    title("");
    displayExpandWidthBy(internal::DEFAULT_LEGEND_FRAME_EXTRA_WIDTH);
    displayExpandHeightBy(internal::DEFAULT_LEGEND_FRAME_EXTRA_HEIGHT);
    displaySymbolLength(internal::DEFAULT_LEGEND_SAMPLE_LENGTH);
    displaySpacing(internal::DEFAULT_LEGEND_SPACING);
    displayVertical();
    displayLabelsAfterSymbols();
    displayJustifyLeft();
    displayStartFromFirst();
    opaque();
}